

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O1

UniquePtr<X509> __thiscall
anon_unknown.dwarf_b4327e::ReencodeCertificate(anon_unknown_dwarf_b4327e *this,X509 *cert)

{
  uint uVar1;
  X509 *pXVar2;
  UniquePtr<uint8_t> free_der;
  uint8_t *inp;
  uint8_t *der;
  _Head_base<0UL,_unsigned_char_*,_false> local_28;
  uchar *local_20;
  uint8_t *local_18;
  
  local_18 = (uchar *)0x0;
  uVar1 = i2d_X509(cert,&local_18);
  local_28._M_head_impl = local_18;
  if ((int)uVar1 < 1) {
    *(undefined8 *)this = 0;
  }
  else {
    local_20 = local_18;
    pXVar2 = d2i_X509((X509 **)0x0,&local_20,(ulong)uVar1);
    *(X509 **)this = pXVar2;
  }
  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_28);
  return (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<X509> ReencodeCertificate(X509 *cert) {
  uint8_t *der = nullptr;
  int len = i2d_X509(cert, &der);
  bssl::UniquePtr<uint8_t> free_der(der);
  if (len <= 0) {
    return nullptr;
  }

  const uint8_t *inp = der;
  return bssl::UniquePtr<X509>(d2i_X509(nullptr, &inp, len));
}